

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Sol * exampleB(Sol *__return_storage_ptr__,vector<ride,_std::allocator<ride>_> *rides,long vehs,
              long STEPS)

{
  ride *prVar1;
  long lVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  ride *prVar6;
  long *plVar7;
  reference this;
  reference rVar8;
  reference local_148;
  value_type *local_138;
  ride *chosen;
  long local_128;
  long local_120;
  long end_time;
  long closeness;
  _Bit_type local_108;
  const_reference local_100;
  ride *r;
  long i_1;
  long min_end;
  long min_idx;
  long min_closeness;
  veh v;
  long used_rides;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long i;
  priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_> vehicles;
  allocator<bool> local_52;
  bool local_51;
  undefined1 local_50 [8];
  vector<bool,_std::allocator<bool>_> used;
  long STEPS_local;
  long vehs_local;
  vector<ride,_std::allocator<ride>_> *rides_local;
  Sol *sol;
  
  used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
       = (_Bit_pointer)STEPS;
  sVar4 = std::vector<ride,_std::allocator<ride>_>::size(rides);
  local_51 = false;
  std::allocator<bool>::allocator(&local_52);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_50,sVar4,&local_51,&local_52);
  std::allocator<bool>::~allocator(&local_52);
  vehicles._27_1_ = 0;
  std::allocator<std::vector<ride,_std::allocator<ride>_>_>::allocator
            ((allocator<std::vector<ride,_std::allocator<ride>_>_> *)&vehicles.field_0x1a);
  std::
  vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ::vector(__return_storage_ptr__,vehs,(allocator_type *)&vehicles.field_0x1a);
  std::allocator<std::vector<ride,_std::allocator<ride>_>_>::~allocator
            ((allocator<std::vector<ride,_std::allocator<ride>_>_> *)&vehicles.field_0x1a);
  std::priority_queue<veh,std::vector<veh,std::allocator<veh>>,std::less<veh>>::
  priority_queue<std::vector<veh,std::allocator<veh>>,void>
            ((priority_queue<veh,std::vector<veh,std::allocator<veh>>,std::less<veh>> *)&i);
  for (local_90 = 0; local_90 < vehs; local_90 = local_90 + 1) {
    used_rides = local_90;
    local_a8 = 0;
    local_a0 = 0;
    local_98 = 0;
    std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::push
              ((priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_> *)&i,
               (value_type *)&used_rides);
  }
  v.loc.y = 0;
  while( true ) {
    lVar2 = v.loc.y;
    sVar4 = std::vector<ride,_std::allocator<ride>_>::size(rides);
    if (sVar4 <= (ulong)lVar2) break;
    pvVar5 = std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::top
                       ((priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>
                         *)&i);
    min_closeness = pvVar5->id;
    v.id = pvVar5->avail_time;
    v.avail_time = (pvVar5->loc).x;
    v.loc.x = (pvVar5->loc).y;
    std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::pop
              ((priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_> *)&i);
    if ((long)used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage <= v.id) break;
    min_idx = 0x7fffffffffffffff;
    min_end = -1;
    i_1 = 0;
    r = (ride *)0x0;
    while( true ) {
      prVar1 = r;
      prVar6 = (ride *)std::vector<ride,_std::allocator<ride>_>::size(rides);
      if (prVar6 <= prVar1) break;
      local_100 = std::vector<ride,_std::allocator<ride>_>::operator[](rides,(size_type)r);
      rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_50,(size_type)r);
      local_108 = rVar8._M_mask;
      closeness = (long)rVar8._M_p;
      bVar3 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&closeness);
      if ((!bVar3) && (v.id <= local_100->e_time)) {
        end_time = dist((pt *)&v.avail_time,&local_100->start);
        local_128 = v.id + end_time + local_100->len;
        chosen = (ride *)(local_100->s_time + local_100->len);
        plVar7 = std::max<long>(&local_128,(long *)&chosen);
        local_120 = *plVar7;
        if ((end_time < min_idx) && (local_120 <= local_100->e_time)) {
          min_idx = end_time;
          min_end = (long)r;
          i_1 = local_120;
        }
      }
      r = (ride *)((long)&r->id + 1);
    }
    if (-1 < min_end) {
      local_138 = std::vector<ride,_std::allocator<ride>_>::operator[](rides,min_end);
      this = std::
             vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
             ::operator[](__return_storage_ptr__,min_closeness);
      std::vector<ride,_std::allocator<ride>_>::push_back(this,local_138);
      rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_50,min_end);
      local_148 = rVar8;
      std::_Bit_reference::operator=(&local_148,true);
      v.id = i_1;
      if (local_138->e_time < i_1) {
        __assert_fail("min_end <= chosen.e_time",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/oskopek[P]ghc18/main.cpp"
                      ,0x89,"Sol exampleB(const vector<ride> &, const long, const long)");
      }
      v.avail_time = (local_138->end).x;
      v.loc.x = (local_138->end).y;
      std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::push
                ((priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_> *)&i,
                 (value_type *)&min_closeness);
    }
    v.loc.y = v.loc.y + 1;
  }
  vehicles._27_1_ = 1;
  std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::~priority_queue
            ((priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_> *)&i);
  if ((vehicles._27_1_ & 1) == 0) {
    std::
    vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_50)
  ;
  return __return_storage_ptr__;
}

Assistant:

Sol exampleB(const vector<ride>& rides, const long vehs, const long STEPS) {
    vector<bool> used(rides.size(), false);
    Sol sol(vehs);
    priority_queue<veh> vehicles;
    for (long i = 0; i < vehs; i++) {
        vehicles.push(veh{i, 0, pt{0, 0}});
    }

    for (long used_rides = 0; used_rides < rides.size(); used_rides++) {
        veh v = vehicles.top(); vehicles.pop();
        if (v.avail_time >= STEPS) break;

        // Find closest ride
        long min_closeness = LONG_MAX;
        long min_idx = -1;
        long min_end = 0;
        for (long i = 0; i < rides.size(); i++) {
            const ride& r = rides[i];
            if (used[i]) continue;
            if (r.e_time < v.avail_time) continue;
            const long closeness = dist(v.loc, r.start);
            const long end_time = max(v.avail_time + closeness + r.len, r.s_time + r.len); // max(no-wait, wait)
            if (closeness < min_closeness && end_time <= r.e_time) {
                min_closeness = closeness;
                min_idx = i;
                min_end = end_time;
            }
        }

        if (min_idx < 0) {
            continue; // leave out this car, cannot use it again
        }
        // Update sol
        const ride& chosen = rides[min_idx];
        sol[v.id].push_back(chosen);
        used[min_idx] = true;

        // Update vehicle
        v.avail_time = min_end;
        assert(min_end <= chosen.e_time);
        v.loc = chosen.end;
        vehicles.push(v);
    }

    return sol;
}